

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

char * jieba_lookup_tag(jieba_t *handle,char *str)

{
  char *pcVar1;
  string tag;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,str,&local_51);
  cppjieba::MixSegment::LookupTag(&local_30,(MixSegment *)(handle + 0x310),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = strdup(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

char* jieba_lookup_tag(jieba_t* handle, const char* str) {
  std::string tag = ((cppjieba::Jieba*)handle)->LookupTag(str);
  return strdup(tag.c_str());
}